

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instancenorm.cpp
# Opt level: O2

int __thiscall
ncnn::InstanceNorm::forward_inplace(InstanceNorm *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  int i;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 in_XMM4 [16];
  undefined1 auVar11 [16];
  Mat local_70;
  
  uVar3 = bottom_top_blob->h * bottom_top_blob->w;
  uVar5 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  for (; (long)uVar5 < (long)this->channels; uVar5 = uVar5 + 1) {
    Mat::channel(&local_70,bottom_top_blob,(int)uVar5);
    pvVar1 = local_70.data;
    Mat::~Mat(&local_70);
    fVar6 = 0.0;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      fVar6 = fVar6 + *(float *)((long)pvVar1 + uVar2 * 4);
    }
    fVar6 = fVar6 * (1.0 / (float)(int)uVar3);
    fVar7 = 0.0;
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      fVar9 = *(float *)((long)pvVar1 + uVar2 * 4) - fVar6;
      fVar7 = fVar7 + fVar9 * fVar9;
    }
    fVar9 = *(float *)((long)(this->gamma_data).data + uVar5 * 4);
    fVar8 = fVar7 * (1.0 / (float)(int)uVar3) + this->eps;
    fVar7 = *(float *)((long)(this->beta_data).data + uVar5 * 4);
    auVar11 = rsqrtss(in_XMM4,ZEXT416((uint)fVar8));
    fVar10 = auVar11._0_4_;
    in_XMM4._4_12_ = auVar11._4_12_;
    in_XMM4._0_4_ = fVar10 * -0.5 * (fVar8 * fVar10 * fVar10 + -3.0);
    for (uVar2 = 0; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      *(float *)((long)pvVar1 + uVar2 * 4) =
           (*(float *)((long)pvVar1 + uVar2 * 4) - fVar6) * fVar9 * in_XMM4._0_4_ + fVar7;
    }
  }
  return 0;
}

Assistant:

int InstanceNorm::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // x = (x - mean) / (sqrt(var) + eps) * gamma + beta

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int size = w * h;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        // mean and var
        float sum = 0.f;
        float sqsum = 0.f;
        for (int i=0; i<size; i++)
        {
            sum += ptr[i];
            //sqsum += ptr[i] * ptr[i];
        }
        float mean = sum / size;
        float tmp = 0.f;
        for (int i=0; i<size; i++)
        {
            tmp = ptr[i] - mean;
            sqsum += tmp * tmp;
        }
        float var = sqsum / size;
        // the var maybe minus due to accuracy
        //float var = sqsum / size - mean * mean;

        float gamma = gamma_data[q];
        float beta = beta_data[q];

        float a = static_cast<float>(gamma / (sqrt(var + eps)));
        float b = - mean * a + beta;

        for (int i=0; i<size; i++)
        {
            ptr[i] = ptr[i] * a + b;
        }
    }

    return 0;
}